

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  FILE *pFVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  void *inner_arkode_mem;
  void *arkode_mem;
  SUNContext ctx;
  sunrealtype t;
  MRIStepInnerStepper inner_stepper;
  long local_70;
  long local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  undefined8 local_40;
  long *local_38;
  
  local_68 = 0;
  local_70 = 0;
  local_40 = 0;
  uVar1 = SUNContext_Create(0,&local_58);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    plVar2 = (long *)malloc(0x20);
    *plVar2 = 0x3e9;
    plVar2[1] = 0x3f747ae147ae147b;
    plVar2[2] = 0x3f847ae147ae147b;
    plVar2[3] = 0x401c48c6001f0ac0;
    puts("\n1D reaction-diffusion PDE test problem:");
    printf("  N = %li\n",*plVar2);
    printf("  diffusion coefficient:  k = %g\n",(int)plVar2[2]);
    lVar3 = N_VNew_Serial(0x3e9,local_58);
    if (lVar3 == 0) {
      main_cold_4();
      return 1;
    }
    lVar7 = *plVar2;
    local_60 = (double)plVar2[3];
    local_50 = (double)plVar2[1];
    lVar4 = N_VGetArrayPointer(lVar3);
    if (lVar4 == 0) {
      main_cold_1();
      uVar10 = 0xffffffff;
    }
    else {
      uVar10 = 0;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          dVar11 = exp(((double)lVar9 * local_50 + -1.0) * local_60);
          *(double *)(lVar4 + lVar9 * 8) = 1.0 / (dVar11 + 1.0);
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
    }
    if (lVar4 == 0) {
      pcVar6 = "SetInitialCondition";
      goto LAB_001019d6;
    }
    local_70 = ARKStepCreate(0,ff,0,lVar3,local_58);
    if (local_70 == 0) {
      main_cold_3();
      return 1;
    }
    uVar1 = ARKodeSetUserData(local_70,plVar2);
    if ((int)uVar1 < 0) {
LAB_001018ec:
      pcVar6 = "ARKodeSetUserData";
    }
    else {
      uVar1 = ARKStepSetTableNum(local_70,0xffffffff,0xc);
      if ((int)uVar1 < 0) {
        pcVar6 = "ARKStepSetTableNum";
      }
      else {
        uVar1 = ARKodeSetFixedStep(0x88e368f1,local_70);
        if ((int)uVar1 < 0) {
LAB_00101909:
          pcVar6 = "ARKodeSetFixedStep";
        }
        else {
          uVar1 = ARKStepCreateMRIStepInnerStepper(local_70,&local_40);
          if ((int)uVar1 < 0) {
            pcVar6 = "ARKStepCreateMRIStepInnerStepper";
          }
          else {
            local_68 = MRIStepCreate(0,fs,0,lVar3,local_40,local_58);
            if (local_68 == 0) {
              main_cold_2();
              return 1;
            }
            uVar1 = ARKodeSetUserData(local_68,plVar2);
            if ((int)uVar1 < 0) goto LAB_001018ec;
            uVar1 = ARKodeSetFixedStep(0xd2f1a9fc,local_68);
            if ((int)uVar1 < 0) goto LAB_00101909;
            uVar1 = ARKodeSetMaxNumSteps(local_68,10000);
            if (-1 < (int)uVar1) {
              pFVar5 = fopen("heat_mesh.txt","w");
              lVar7 = 0;
              do {
                fprintf(pFVar5,"  %.16e\n",SUB84((double)lVar7 * (double)plVar2[1],0));
                lVar7 = lVar7 + 1;
              } while (lVar7 != 0x3e9);
              fclose(pFVar5);
              pFVar5 = fopen("heat1D.txt","w");
              lVar7 = N_VGetArrayPointer(lVar3);
              lVar4 = 0;
              do {
                fprintf(pFVar5," %.16e",(int)*(undefined8 *)(lVar7 + lVar4 * 8));
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0x3e9);
              fputc(10,pFVar5);
              local_48 = 0.0;
              puts("        t      ||u||_rms");
              puts("   -------------------------");
              local_60 = local_48;
              dVar11 = (double)N_VDotProd(lVar3,lVar3);
              dVar11 = dVar11 / 1001.0;
              if (dVar11 < 0.0) {
                dVar11 = sqrt(dVar11);
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              local_38 = plVar2;
              printf("  %10.6f  %10.6f\n",SUB84(local_60,0),dVar11);
              dVar11 = 0.1;
              iVar8 = 0;
              do {
                local_60 = dVar11;
                uVar1 = ARKodeEvolve(local_68,lVar3,&local_48,1);
                if ((int)uVar1 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                          "ARKodeEvolve",(ulong)uVar1);
                  break;
                }
                local_50 = local_48;
                dVar11 = (double)N_VDotProd(lVar3,lVar3);
                dVar11 = dVar11 / 1001.0;
                if (dVar11 < 0.0) {
                  dVar11 = sqrt(dVar11);
                }
                else {
                  dVar11 = SQRT(dVar11);
                }
                printf("  %10.6f  %10.6f\n",SUB84(local_50,0),dVar11);
                lVar4 = 0;
                do {
                  fprintf(pFVar5," %.16e",(int)*(undefined8 *)(lVar7 + lVar4 * 8));
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 0x3e9);
                fputc(10,pFVar5);
                dVar11 = 3.0;
                if (local_60 + 0.1 <= 3.0) {
                  dVar11 = local_60 + 0.1;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 != 0x1e);
              puts("   -------------------------");
              fclose(pFVar5);
              puts("\nFinal Slow Statistics:");
              ARKodePrintAllStats(local_68,_stdout,0);
              puts("\nFinal Fast Statistics:");
              ARKodePrintAllStats(local_70,_stdout,0);
              pFVar5 = fopen("ark_reaction_diffusion_mri_slow_stats.csv","w");
              ARKodePrintAllStats(local_68,pFVar5,1);
              fclose(pFVar5);
              pFVar5 = fopen("ark_reaction_diffusion_mri_fast_stats.csv","w");
              ARKodePrintAllStats(local_70,pFVar5,1);
              fclose(pFVar5);
              N_VDestroy(lVar3);
              ARKodeFree(&local_70);
              MRIStepInnerStepper_Free(&local_40);
              ARKodeFree(&local_68);
              free(local_38);
              SUNContext_Free(&local_58);
              return 0;
            }
            pcVar6 = "ARKodeSetMaxNumSteps";
          }
        }
      }
    }
  }
  uVar10 = (ulong)uVar1;
LAB_001019d6:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,uVar10);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(3.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.00002);   /* fast step size */
  UserData udata    = NULL;                  /* user data */

  sunrealtype* data;                /* array for solution output */
  sunrealtype L  = SUN_RCONST(5.0); /* domain length */
  sunindextype N = 1001;            /* number of mesh points */
  sunrealtype ep = SUN_RCONST(1e-2);
  sunindextype i;

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE *FID, *UFID;
  sunrealtype t, tout;
  int iout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /*
   * Initialization
   */

  /* allocate and fill user data structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->N   = N;
  udata->dx  = L / (SUN_RCONST(1.0) * N - SUN_RCONST(1.0));
  udata->k   = SUN_RCONST(1e-4) / ep;
  udata->lam = SUN_RCONST(0.5) * sqrt(SUN_RCONST(2.0) * ep * SUN_RCONST(1e4));

  /* Initial problem output */
  printf("\n1D reaction-diffusion PDE test problem:\n");
  printf("  N = %li\n", (long int)udata->N);
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(N, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  retval = SetInitialCondition(y, udata);
  if (check_retval(&retval, "SetInitialCondition", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Increase max num steps  */
  retval = ARKodeSetMaxNumSteps(arkode_mem, 10000);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* output mesh to disk */
  FID = fopen("heat_mesh.txt", "w");
  for (i = 0; i < N; i++) { fprintf(FID, "  %.16" ESYM "\n", udata->dx * i); }
  fclose(FID);

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");
  data = N_VGetArrayPointer(y);

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
  fprintf(UFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results. Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms\n");
  printf("   -------------------------\n");
  printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* print solution stats and output results to disk */
    printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
    fprintf(UFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   -------------------------\n");
  fclose(UFID);

  /* Print final statistics to the screen */
  printf("\nFinal Slow Statistics:\n");
  retval = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  printf("\nFinal Fast Statistics:\n");
  retval = ARKodePrintAllStats(inner_arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("ark_reaction_diffusion_mri_slow_stats.csv", "w");
  retval = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);
  FID    = fopen("ark_reaction_diffusion_mri_fast_stats.csv", "w");
  retval = ARKodePrintAllStats(inner_arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  free(udata);                              /* Free user data */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}